

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

void __thiscall
testing::internal::
TypedExpectation<void_(const_bssl::CertPathBuilder_&,_bssl::CertPathBuilderResultPath_*)>::
TypedExpectation(TypedExpectation<void_(const_bssl::CertPathBuilder_&,_bssl::CertPathBuilderResultPath_*)>
                 *this,FunctionMocker<void_(const_bssl::CertPathBuilder_&,_bssl::CertPathBuilderResultPath_*)>
                       *owner,char *a_file,int a_line,string *a_source_text,ArgumentMatcherTuple *m)

{
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_006c2e40;
  this->owner_ = owner;
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_bssl::CertPathBuilder_&>,_testing::Matcher<bssl::CertPathBuilderResultPath_*>_>
  ::_Tuple_impl(&(this->matchers_).
                 super__Tuple_impl<0UL,_testing::Matcher<const_bssl::CertPathBuilder_&>,_testing::Matcher<bssl::CertPathBuilderResultPath_*>_>
                ,&m->
                  super__Tuple_impl<0UL,_testing::Matcher<const_bssl::CertPathBuilder_&>,_testing::Matcher<bssl::CertPathBuilderResultPath_*>_>
               );
  (this->extra_matcher_).
  super_MatcherBase<const_std::tuple<const_bssl::CertPathBuilder_&,_bssl::CertPathBuilderResultPath_*>_&>
  .buffer_.ptr = (void *)0x0;
  (this->extra_matcher_).
  super_MatcherBase<const_std::tuple<const_bssl::CertPathBuilder_&,_bssl::CertPathBuilderResultPath_*>_&>
  .vtable_ = (VTable *)
             MatcherBase<std::tuple<bssl::CertPathBuilder_const&,bssl::CertPathBuilderResultPath*>const&>
             ::
             GetVTable<testing::internal::MatcherBase<std::tuple<bssl::CertPathBuilder_const&,bssl::CertPathBuilderResultPath*>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
             ::kVTable;
  (this->extra_matcher_).
  super_MatcherBase<const_std::tuple<const_bssl::CertPathBuilder_&,_bssl::CertPathBuilderResultPath_*>_&>
  .super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_006c2e88;
  *(undefined8 *)&(this->repeated_action_).fun_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->repeated_action_).fun_.super__Function_base._M_functor + 8) = 0;
  (this->repeated_action_).fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->repeated_action_).fun_._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

TypedExpectation(FunctionMocker<F>* owner, const char* a_file, int a_line,
                   const std::string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that causes ambiguity between
        // Matcher's copy and move constructor for some argument types.
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}